

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::IsFlat(CordRepBtree *this,string_view *fragment)

{
  int iVar1;
  size_t sVar2;
  string_view sVar3;
  size_t local_30;
  char *local_28;
  string_view *fragment_local;
  CordRepBtree *this_local;
  
  iVar1 = height(this);
  if ((iVar1 == 0) && (sVar2 = size(this), sVar2 == 1)) {
    if (fragment != (string_view *)0x0) {
      sVar2 = begin(this);
      sVar3 = Data(this,sVar2);
      local_30 = sVar3._M_len;
      fragment->_M_len = local_30;
      local_28 = sVar3._M_str;
      fragment->_M_str = local_28;
    }
    return true;
  }
  return false;
}

Assistant:

bool CordRepBtree::IsFlat(absl::string_view* fragment) const {
  if (height() == 0 && size() == 1) {
    if (fragment) *fragment = Data(begin());
    return true;
  }
  return false;
}